

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::BufferStorage::GetBufferParameterTest::GetBufferParameterTest
          (GetBufferParameterTest *this,Context *context)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
  *pvVar4;
  uint uVar5;
  long lVar6;
  testCase local_78;
  uint local_70;
  int local_6c;
  uint local_68;
  uint local_64;
  vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
  *local_60;
  long local_58;
  GetBufferParameterTest *local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"get_buffer_parameter",
             "Test queries for parameters of buffers");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetBufferParameterTest_01dbc8e8;
  pvVar4 = &this->m_test_cases;
  (this->m_test_cases).
  super__Vector_base<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = pvVar4;
  local_50 = this;
  for (uVar3 = 0; (int)uVar3 != 2; uVar3 = (ulong)((int)uVar3 + 1)) {
    local_70 = (uint)((int)uVar3 != 0) << 8;
    local_48 = uVar3;
    for (local_6c = 0; local_6c != 2; local_6c = local_6c + 1) {
      local_78.m_flags = local_70 | (uint)(local_6c != 0) << 9;
      local_70 = local_78.m_flags;
      if (local_78.m_flags != 0) {
        local_78.m_access = 0;
        std::
        vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
        ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(pvVar4,&local_78);
      }
      local_58 = 4;
      lVar2 = 0;
      while (lVar2 != 3) {
        uVar5 = GetBufferParameterTest::s_mapping_bits[lVar2] | local_70;
        local_64 = uVar5 | 1;
        local_68 = uVar5 | 2;
        uVar5 = uVar5 | 3;
        lVar6 = 0;
        local_40 = lVar2;
        while (pvVar4 = local_60, local_58 != lVar6) {
          uVar1 = *(uint *)((long)GetBufferParameterTest::s_mapping_bits + lVar6);
          local_78.m_flags = local_64;
          local_78.m_access = uVar1 | 1;
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>
                    (local_60,&local_78);
          local_78.m_flags = local_68;
          local_78.m_access = uVar1 | 2;
          local_38 = lVar6;
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(pvVar4,&local_78);
          local_78.m_flags = uVar5;
          local_78.m_access = uVar1 | 1;
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(pvVar4,&local_78);
          local_78.m_flags = uVar5;
          local_78.m_access = uVar1 | 2;
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(pvVar4,&local_78);
          local_78.m_access = uVar1 | 3;
          local_78.m_flags = uVar5;
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(pvVar4,&local_78);
          lVar6 = local_38 + 4;
        }
        local_58 = local_58 + 4;
        uVar3 = local_48;
        lVar2 = local_40 + 1;
      }
      pvVar4 = local_60;
    }
  }
  return;
}

Assistant:

GetBufferParameterTest::GetBufferParameterTest(deqp::Context& context)
	: TestCase(context, "get_buffer_parameter", "Test queries for parameters of buffers")
{
	static const GLenum s_mapping_bits[] = { 0, GL_MAP_PERSISTENT_BIT, GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT };
	static const GLuint s_n_mapping_bits = sizeof(s_mapping_bits) / sizeof(s_mapping_bits[0]);

	GLenum flags = 0;

	for (GLuint dynamic = 0; dynamic < 2; ++dynamic)
	{
		flags = (0 == dynamic) ? 0 : GL_DYNAMIC_STORAGE_BIT;

		for (GLuint client = 0; client < 2; ++client)
		{
			flags |= (0 == client) ? 0 : GL_CLIENT_STORAGE_BIT;

			/* No "map" bits */
			if (0 != flags)
			{
				m_test_cases.push_back(testCase(flags, 0));
			}

			for (GLuint flag_idx = 0; flag_idx < s_n_mapping_bits; ++flag_idx)
			{
				const GLenum flag_mapping_bits  = s_mapping_bits[flag_idx];
				const GLenum flags_with_mapping = flags | flag_mapping_bits;

				for (GLuint access_idx = 0; access_idx <= flag_idx; ++access_idx)
				{
					const GLenum access = s_mapping_bits[access_idx];

					m_test_cases.push_back(testCase(flags_with_mapping | GL_MAP_READ_BIT, access | GL_MAP_READ_BIT));
					m_test_cases.push_back(testCase(flags_with_mapping | GL_MAP_WRITE_BIT, access | GL_MAP_WRITE_BIT));
					m_test_cases.push_back(
						testCase(flags_with_mapping | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT, access | GL_MAP_READ_BIT));
					m_test_cases.push_back(
						testCase(flags_with_mapping | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT, access | GL_MAP_WRITE_BIT));
					m_test_cases.push_back(testCase(flags_with_mapping | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT,
													access | GL_MAP_WRITE_BIT | GL_MAP_READ_BIT));
				}
			}
		}
	}
}